

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int ly_strequal_(char *s1,char *s2)

{
  int iVar1;
  long lVar2;
  
  if (s1 == s2) {
LAB_0010f3f0:
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    if (s2 != (char *)0x0 && s1 != (char *)0x0) {
      iVar1 = 0;
      for (lVar2 = 0; s1[lVar2] == s2[lVar2]; lVar2 = lVar2 + 1) {
        if (s1[lVar2] == '\0') goto LAB_0010f3f0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
ly_strequal_(const char *s1, const char *s2)
{
    if (s1 == s2) {
        return 1;
    } else if (!s1 || !s2) {
        return 0;
    } else {
        for ( ; *s1 == *s2; s1++, s2++) {
            if (*s1 == '\0') {
                return 1;
            }
        }
        return 0;
    }
}